

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_decompressContinue
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  uint uVar1;
  U32 UVar2;
  size_t sVar3;
  XXH64_hash_t XVar4;
  ZSTD_dStage ZVar5;
  U32 check32;
  U32 h32;
  size_t err_code_2;
  size_t err_code_1;
  size_t rSize;
  size_t cBlockSize;
  int local_48;
  blockProperties_t bp;
  size_t err_code;
  size_t srcSize_local;
  void *src_local;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_DCtx *dctx_local;
  
  sVar3 = ZSTD_nextSrcSizeToDecompressWithInputSize(dctx,srcSize);
  if (srcSize == sVar3) {
    ZSTD_checkContinuity(dctx,dst,dstCapacity);
    dctx->processedCSize = dctx->processedCSize + srcSize;
    switch(dctx->stage) {
    case ZSTDds_getFrameHeaderSize:
      if ((dctx->format == ZSTD_f_zstd1) &&
         (UVar2 = MEM_readLE32(src), (UVar2 & 0xfffffff0) == 0x184d2a50)) {
        memcpy(dctx->headerBuffer,src,srcSize);
        dctx->expected = 8 - srcSize;
        dctx->stage = ZSTDds_decodeSkippableHeader;
        dctx_local = (ZSTD_DCtx *)0x0;
      }
      else {
        sVar3 = ZSTD_frameHeaderSize_internal(src,srcSize,dctx->format);
        dctx->headerSize = sVar3;
        uVar1 = ERR_isError(dctx->headerSize);
        if (uVar1 == 0) {
          memcpy(dctx->headerBuffer,src,srcSize);
          dctx->expected = dctx->headerSize - srcSize;
          dctx->stage = ZSTDds_decodeFrameHeader;
          dctx_local = (ZSTD_DCtx *)0x0;
        }
        else {
          dctx_local = (ZSTD_DCtx *)dctx->headerSize;
        }
      }
      break;
    case ZSTDds_decodeFrameHeader:
      memcpy((void *)((long)dctx + (dctx->headerSize - srcSize) + 0x276b0),src,srcSize);
      bp._4_8_ = ZSTD_decodeFrameHeader(dctx,dctx->headerBuffer,dctx->headerSize);
      uVar1 = ERR_isError(bp._4_8_);
      if (uVar1 == 0) {
        dctx->expected = 3;
        dctx->stage = ZSTDds_decodeBlockHeader;
        dctx_local = (ZSTD_DCtx *)0x0;
      }
      else {
        dctx_local = (ZSTD_DCtx *)bp._4_8_;
      }
      break;
    case ZSTDds_decodeBlockHeader:
      dctx_local = (ZSTD_DCtx *)
                   ZSTD_getcBlockSize(src,3,(blockProperties_t *)((long)&cBlockSize + 4));
      uVar1 = ERR_isError((size_t)dctx_local);
      if (uVar1 == 0) {
        if ((ZSTD_DCtx *)(ulong)(dctx->fParams).blockSizeMax < dctx_local) {
          dctx_local = (ZSTD_DCtx *)0xffffffffffffffec;
        }
        else {
          dctx->expected = (size_t)dctx_local;
          dctx->bType = cBlockSize._4_4_;
          dctx->rleSize = (ulong)bp.blockType;
          if (dctx_local == (ZSTD_DCtx *)0x0) {
            if (local_48 == 0) {
              dctx->expected = 3;
              dctx->stage = ZSTDds_decodeBlockHeader;
            }
            else if ((dctx->fParams).checksumFlag == 0) {
              dctx->expected = 0;
              dctx->stage = ZSTDds_getFrameHeaderSize;
            }
            else {
              dctx->expected = 4;
              dctx->stage = ZSTDds_checkChecksum;
            }
            dctx_local = (ZSTD_DCtx *)0x0;
          }
          else {
            ZVar5 = ZSTDds_decompressBlock;
            if (local_48 != 0) {
              ZVar5 = ZSTDds_decompressLastBlock;
            }
            dctx->stage = ZVar5;
            dctx_local = (ZSTD_DCtx *)0x0;
          }
        }
      }
      break;
    case ZSTDds_decompressBlock:
    case ZSTDds_decompressLastBlock:
      switch(dctx->bType) {
      case bt_raw:
        err_code_1 = ZSTD_copyRawBlock(dst,dstCapacity,src,srcSize);
        uVar1 = ERR_isError(err_code_1);
        if (uVar1 != 0) {
          return err_code_1;
        }
        dctx->expected = dctx->expected - err_code_1;
        break;
      case bt_rle:
        err_code_1 = ZSTD_setRleBlock(dst,dstCapacity,*src,dctx->rleSize);
        dctx->expected = 0;
        break;
      case bt_compressed:
        err_code_1 = ZSTD_decompressBlock_internal(dctx,dst,dstCapacity,src,srcSize,1);
        dctx->expected = 0;
        break;
      case bt_reserved:
      default:
        return 0xffffffffffffffec;
      }
      uVar1 = ERR_isError(err_code_1);
      if (uVar1 == 0) {
        if ((dctx->fParams).blockSizeMax < err_code_1) {
          dctx_local = (ZSTD_DCtx *)0xffffffffffffffec;
        }
        else {
          dctx->decodedSize = err_code_1 + dctx->decodedSize;
          if (dctx->validateChecksum != 0) {
            XXH64_update(&dctx->xxhState,dst,err_code_1);
          }
          dctx->previousDstEnd = (void *)((long)dst + err_code_1);
          if (dctx->expected == 0) {
            if (dctx->stage == ZSTDds_decompressLastBlock) {
              if (((dctx->fParams).frameContentSize != 0xffffffffffffffff) &&
                 (dctx->decodedSize != (dctx->fParams).frameContentSize)) {
                return 0xffffffffffffffec;
              }
              if ((dctx->fParams).checksumFlag == 0) {
                ZSTD_DCtx_trace_end(dctx,dctx->decodedSize,dctx->processedCSize,1);
                dctx->expected = 0;
                dctx->stage = ZSTDds_getFrameHeaderSize;
              }
              else {
                dctx->expected = 4;
                dctx->stage = ZSTDds_checkChecksum;
              }
            }
            else {
              dctx->stage = ZSTDds_decodeBlockHeader;
              dctx->expected = 3;
            }
            dctx_local = (ZSTD_DCtx *)err_code_1;
          }
          else {
            dctx_local = (ZSTD_DCtx *)err_code_1;
          }
        }
      }
      else {
        dctx_local = (ZSTD_DCtx *)err_code_1;
      }
      break;
    case ZSTDds_checkChecksum:
      if (dctx->validateChecksum != 0) {
        XVar4 = XXH64_digest(&dctx->xxhState);
        UVar2 = MEM_readLE32(src);
        if (UVar2 != (U32)XVar4) {
          return 0xffffffffffffffea;
        }
      }
      ZSTD_DCtx_trace_end(dctx,dctx->decodedSize,dctx->processedCSize,1);
      dctx->expected = 0;
      dctx->stage = ZSTDds_getFrameHeaderSize;
      dctx_local = (ZSTD_DCtx *)0x0;
      break;
    case ZSTDds_decodeSkippableHeader:
      memcpy((void *)((long)dctx + (0x276b8 - srcSize)),src,srcSize);
      UVar2 = MEM_readLE32(dctx->headerBuffer + 4);
      dctx->expected = (ulong)UVar2;
      dctx->stage = ZSTDds_skipFrame;
      dctx_local = (ZSTD_DCtx *)0x0;
      break;
    case ZSTDds_skipFrame:
      dctx->expected = 0;
      dctx->stage = ZSTDds_getFrameHeaderSize;
      dctx_local = (ZSTD_DCtx *)0x0;
      break;
    default:
      dctx_local = (ZSTD_DCtx *)0xffffffffffffffff;
    }
  }
  else {
    dctx_local = (ZSTD_DCtx *)0xffffffffffffffb8;
  }
  return (size_t)dctx_local;
}

Assistant:

size_t ZSTD_decompressContinue(ZSTD_DCtx* dctx, void* dst, size_t dstCapacity, const void* src, size_t srcSize)
{
    DEBUGLOG(5, "ZSTD_decompressContinue (srcSize:%u)", (unsigned)srcSize);
    /* Sanity check */
    RETURN_ERROR_IF(srcSize != ZSTD_nextSrcSizeToDecompressWithInputSize(dctx, srcSize), srcSize_wrong, "not allowed");
    ZSTD_checkContinuity(dctx, dst, dstCapacity);

    dctx->processedCSize += srcSize;

    switch (dctx->stage)
    {
    case ZSTDds_getFrameHeaderSize :
        assert(src != NULL);
        if (dctx->format == ZSTD_f_zstd1) {  /* allows header */
            assert(srcSize >= ZSTD_FRAMEIDSIZE);  /* to read skippable magic number */
            if ((MEM_readLE32(src) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {        /* skippable frame */
                ZSTD_memcpy(dctx->headerBuffer, src, srcSize);
                dctx->expected = ZSTD_SKIPPABLEHEADERSIZE - srcSize;  /* remaining to load to get full skippable frame header */
                dctx->stage = ZSTDds_decodeSkippableHeader;
                return 0;
        }   }
        dctx->headerSize = ZSTD_frameHeaderSize_internal(src, srcSize, dctx->format);
        if (ZSTD_isError(dctx->headerSize)) return dctx->headerSize;
        ZSTD_memcpy(dctx->headerBuffer, src, srcSize);
        dctx->expected = dctx->headerSize - srcSize;
        dctx->stage = ZSTDds_decodeFrameHeader;
        return 0;

    case ZSTDds_decodeFrameHeader:
        assert(src != NULL);
        ZSTD_memcpy(dctx->headerBuffer + (dctx->headerSize - srcSize), src, srcSize);
        FORWARD_IF_ERROR(ZSTD_decodeFrameHeader(dctx, dctx->headerBuffer, dctx->headerSize), "");
        dctx->expected = ZSTD_blockHeaderSize;
        dctx->stage = ZSTDds_decodeBlockHeader;
        return 0;

    case ZSTDds_decodeBlockHeader:
        {   blockProperties_t bp;
            size_t const cBlockSize = ZSTD_getcBlockSize(src, ZSTD_blockHeaderSize, &bp);
            if (ZSTD_isError(cBlockSize)) return cBlockSize;
            RETURN_ERROR_IF(cBlockSize > dctx->fParams.blockSizeMax, corruption_detected, "Block Size Exceeds Maximum");
            dctx->expected = cBlockSize;
            dctx->bType = bp.blockType;
            dctx->rleSize = bp.origSize;
            if (cBlockSize) {
                dctx->stage = bp.lastBlock ? ZSTDds_decompressLastBlock : ZSTDds_decompressBlock;
                return 0;
            }
            /* empty block */
            if (bp.lastBlock) {
                if (dctx->fParams.checksumFlag) {
                    dctx->expected = 4;
                    dctx->stage = ZSTDds_checkChecksum;
                } else {
                    dctx->expected = 0; /* end of frame */
                    dctx->stage = ZSTDds_getFrameHeaderSize;
                }
            } else {
                dctx->expected = ZSTD_blockHeaderSize;  /* jump to next header */
                dctx->stage = ZSTDds_decodeBlockHeader;
            }
            return 0;
        }

    case ZSTDds_decompressLastBlock:
    case ZSTDds_decompressBlock:
        DEBUGLOG(5, "ZSTD_decompressContinue: case ZSTDds_decompressBlock");
        {   size_t rSize;
            switch(dctx->bType)
            {
            case bt_compressed:
                DEBUGLOG(5, "ZSTD_decompressContinue: case bt_compressed");
                rSize = ZSTD_decompressBlock_internal(dctx, dst, dstCapacity, src, srcSize, /* frame */ 1);
                dctx->expected = 0;  /* Streaming not supported */
                break;
            case bt_raw :
                assert(srcSize <= dctx->expected);
                rSize = ZSTD_copyRawBlock(dst, dstCapacity, src, srcSize);
                FORWARD_IF_ERROR(rSize, "ZSTD_copyRawBlock failed");
                assert(rSize == srcSize);
                dctx->expected -= rSize;
                break;
            case bt_rle :
                rSize = ZSTD_setRleBlock(dst, dstCapacity, *(const BYTE*)src, dctx->rleSize);
                dctx->expected = 0;  /* Streaming not supported */
                break;
            case bt_reserved :   /* should never happen */
            default:
                RETURN_ERROR(corruption_detected, "invalid block type");
            }
            FORWARD_IF_ERROR(rSize, "");
            RETURN_ERROR_IF(rSize > dctx->fParams.blockSizeMax, corruption_detected, "Decompressed Block Size Exceeds Maximum");
            DEBUGLOG(5, "ZSTD_decompressContinue: decoded size from block : %u", (unsigned)rSize);
            dctx->decodedSize += rSize;
            if (dctx->validateChecksum) XXH64_update(&dctx->xxhState, dst, rSize);
            dctx->previousDstEnd = (char*)dst + rSize;

            /* Stay on the same stage until we are finished streaming the block. */
            if (dctx->expected > 0) {
                return rSize;
            }

            if (dctx->stage == ZSTDds_decompressLastBlock) {   /* end of frame */
                DEBUGLOG(4, "ZSTD_decompressContinue: decoded size from frame : %u", (unsigned)dctx->decodedSize);
                RETURN_ERROR_IF(
                    dctx->fParams.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN
                 && dctx->decodedSize != dctx->fParams.frameContentSize,
                    corruption_detected, "");
                if (dctx->fParams.checksumFlag) {  /* another round for frame checksum */
                    dctx->expected = 4;
                    dctx->stage = ZSTDds_checkChecksum;
                } else {
                    ZSTD_DCtx_trace_end(dctx, dctx->decodedSize, dctx->processedCSize, /* streaming */ 1);
                    dctx->expected = 0;   /* ends here */
                    dctx->stage = ZSTDds_getFrameHeaderSize;
                }
            } else {
                dctx->stage = ZSTDds_decodeBlockHeader;
                dctx->expected = ZSTD_blockHeaderSize;
            }
            return rSize;
        }

    case ZSTDds_checkChecksum:
        assert(srcSize == 4);  /* guaranteed by dctx->expected */
        {
            if (dctx->validateChecksum) {
                U32 const h32 = (U32)XXH64_digest(&dctx->xxhState);
                U32 const check32 = MEM_readLE32(src);
                DEBUGLOG(4, "ZSTD_decompressContinue: checksum : calculated %08X :: %08X read", (unsigned)h32, (unsigned)check32);
                RETURN_ERROR_IF(check32 != h32, checksum_wrong, "");
            }
            ZSTD_DCtx_trace_end(dctx, dctx->decodedSize, dctx->processedCSize, /* streaming */ 1);
            dctx->expected = 0;
            dctx->stage = ZSTDds_getFrameHeaderSize;
            return 0;
        }

    case ZSTDds_decodeSkippableHeader:
        assert(src != NULL);
        assert(srcSize <= ZSTD_SKIPPABLEHEADERSIZE);
        ZSTD_memcpy(dctx->headerBuffer + (ZSTD_SKIPPABLEHEADERSIZE - srcSize), src, srcSize);   /* complete skippable header */
        dctx->expected = MEM_readLE32(dctx->headerBuffer + ZSTD_FRAMEIDSIZE);   /* note : dctx->expected can grow seriously large, beyond local buffer size */
        dctx->stage = ZSTDds_skipFrame;
        return 0;

    case ZSTDds_skipFrame:
        dctx->expected = 0;
        dctx->stage = ZSTDds_getFrameHeaderSize;
        return 0;

    default:
        assert(0);   /* impossible */
        RETURN_ERROR(GENERIC, "impossible to reach");   /* some compiler require default to do something */
    }
}